

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

void Ssw_SmlSimulateOneDyn_rec(Ssw_Sml_t *p,Aig_Obj_t *pObj,int f,int *pVisited,int nVisCounter)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  
  iVar2 = pObj->Id * p->nFrames + f;
  if (pVisited[iVar2] != nVisCounter) {
    pVisited[iVar2] = nVisCounter;
    if (((*(uint *)&pObj->field_0x18 & 7) == 2) &&
       (pAVar1 = p->pAig, iVar2 = Aig_ObjCioId(pObj), iVar2 < pAVar1->nTruePis)) {
      return;
    }
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    if ((*(uint *)&pObj->field_0x18 & 7) != 1) {
      iVar2 = Saig_ObjIsLo(p->pAig,pObj);
      if (iVar2 == 0) {
        uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
        if ((uVar3 & 7) == 3) {
          pAVar1 = p->pAig;
          iVar2 = Aig_ObjCioId(pObj);
          if (pAVar1->nTruePos <= iVar2) {
            Ssw_SmlSimulateOneDyn_rec
                      (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f,pVisited,
                       nVisCounter);
            Ssw_SmlNodeCopyFanin(p,pObj,f);
            return;
          }
          uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
        }
        if ((uVar3 & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                        ,0x44c,
                        "void Ssw_SmlSimulateOneDyn_rec(Ssw_Sml_t *, Aig_Obj_t *, int, int *, int)")
          ;
        }
        Ssw_SmlSimulateOneDyn_rec
                  (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f,pVisited,nVisCounter
                  );
        Ssw_SmlSimulateOneDyn_rec
                  (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),f,pVisited,nVisCounter
                  );
        Ssw_SmlNodeSimulate(p,pObj,f);
        return;
      }
      if (f != 0) {
        pAVar4 = Saig_ObjLoToLi(p->pAig,pObj);
        Ssw_SmlSimulateOneDyn_rec(p,pAVar4,f + -1,pVisited,nVisCounter);
        pAVar4 = Saig_ObjLoToLi(p->pAig,pObj);
        Ssw_SmlNodeTransferNext(p,pAVar4,pObj,f + -1);
        return;
      }
    }
  }
  return;
}

Assistant:

void Ssw_SmlSimulateOneDyn_rec( Ssw_Sml_t * p, Aig_Obj_t * pObj, int f, int * pVisited, int nVisCounter )
{
//    if ( Aig_ObjIsTravIdCurrent(p->pAig, pObj) )
//        return;
//    Aig_ObjSetTravIdCurrent(p->pAig, pObj);
    if ( pVisited[p->nFrames*pObj->Id+f] == nVisCounter )
        return;
    pVisited[p->nFrames*pObj->Id+f] = nVisCounter;
    if ( Saig_ObjIsPi( p->pAig, pObj ) || Aig_ObjIsConst1(pObj) )
        return;
    if ( Saig_ObjIsLo( p->pAig, pObj ) )
    {
        if ( f == 0 )
            return;
        Ssw_SmlSimulateOneDyn_rec( p, Saig_ObjLoToLi(p->pAig, pObj), f-1, pVisited, nVisCounter );
        Ssw_SmlNodeTransferNext( p, Saig_ObjLoToLi(p->pAig, pObj), pObj, f-1 );
        return;
    }
    if ( Saig_ObjIsLi( p->pAig, pObj ) )
    {
        Ssw_SmlSimulateOneDyn_rec( p, Aig_ObjFanin0(pObj), f, pVisited, nVisCounter );
        Ssw_SmlNodeCopyFanin( p, pObj, f );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Ssw_SmlSimulateOneDyn_rec( p, Aig_ObjFanin0(pObj), f, pVisited, nVisCounter );
    Ssw_SmlSimulateOneDyn_rec( p, Aig_ObjFanin1(pObj), f, pVisited, nVisCounter );
    Ssw_SmlNodeSimulate( p, pObj, f );
}